

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O0

float __thiscall
deqp::gles3::Functional::Vertex3DTextureCase::calculateLod
          (Vertex3DTextureCase *this,Mat3 *transf,Vec2 *dstSize,int textureNdx)

{
  int iVar1;
  Texture3D *this_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float dwdy;
  float dwdx;
  float dvdy;
  float dvdx;
  float dudy;
  float dudx;
  undefined1 local_78 [8];
  Vec3 trans10;
  undefined1 local_60 [8];
  Vec3 trans01;
  undefined1 local_48 [8];
  Vec3 trans00;
  int srcDepth;
  int srcHeight;
  int srcWidth;
  Texture3D *refTexture;
  int textureNdx_local;
  Vec2 *dstSize_local;
  Mat3 *transf_local;
  Vertex3DTextureCase *this_local;
  
  this_00 = glu::Texture3D::getRefTexture(this->m_textures[textureNdx]);
  iVar1 = tcu::Texture3D::getWidth(this_00);
  trans00.m_data[2] = (float)tcu::Texture3D::getHeight(this_00);
  trans00.m_data[1] = (float)tcu::Texture3D::getDepth(this_00);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(trans01.m_data + 1),0.0,0.0,1.0);
  tcu::operator*((tcu *)local_48,transf,(Vector<float,_3> *)(trans01.m_data + 1));
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(trans10.m_data + 1),0.0,1.0,1.0);
  tcu::operator*((tcu *)local_60,transf,(Vector<float,_3> *)(trans10.m_data + 1));
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&dudy,1.0,0.0,1.0);
  tcu::operator*((tcu *)local_78,transf,(Vector<float,_3> *)&dudy);
  fVar2 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_78);
  fVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_48);
  fVar4 = tcu::Vector<float,_2>::x(dstSize);
  fVar4 = ((fVar2 - fVar3) * (float)iVar1) / fVar4;
  fVar2 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_60);
  fVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_48);
  fVar5 = tcu::Vector<float,_2>::y(dstSize);
  fVar5 = ((fVar2 - fVar3) * (float)iVar1) / fVar5;
  fVar2 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_78);
  fVar3 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_48);
  fVar7 = (float)(int)trans00.m_data[2];
  fVar6 = tcu::Vector<float,_2>::x(dstSize);
  fVar6 = ((fVar2 - fVar3) * fVar7) / fVar6;
  fVar2 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_60);
  fVar3 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_48);
  fVar8 = (float)(int)trans00.m_data[2];
  fVar7 = tcu::Vector<float,_2>::y(dstSize);
  fVar7 = ((fVar2 - fVar3) * fVar8) / fVar7;
  fVar2 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_78);
  fVar3 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_48);
  fVar9 = (float)(int)trans00.m_data[1];
  fVar8 = tcu::Vector<float,_2>::x(dstSize);
  fVar8 = ((fVar2 - fVar3) * fVar9) / fVar8;
  fVar2 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_60);
  fVar3 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_48);
  fVar10 = (float)(int)trans00.m_data[1];
  fVar9 = tcu::Vector<float,_2>::y(dstSize);
  fVar9 = ((fVar2 - fVar3) * fVar10) / fVar9;
  fVar2 = de::max<float>(fVar8 * fVar8 + fVar4 * fVar4 + fVar6 * fVar6,
                         fVar9 * fVar9 + fVar5 * fVar5 + fVar7 * fVar7);
  fVar2 = ::deFloatSqrt(fVar2);
  fVar2 = deFloatLog2(fVar2);
  return fVar2;
}

Assistant:

float Vertex3DTextureCase::calculateLod (const Mat3& transf, const Vec2& dstSize, int textureNdx) const
{
	const tcu::Texture3D&	refTexture	= m_textures[textureNdx]->getRefTexture();
	const int				srcWidth	= refTexture.getWidth();
	const int				srcHeight	= refTexture.getHeight();
	const int				srcDepth	= refTexture.getDepth();

	// Calculate transformed coordinates of three screen corners.
	const Vec3				trans00		= transf * Vec3(0.0f, 0.0f, 1.0f);
	const Vec3				trans01		= transf * Vec3(0.0f, 1.0f, 1.0f);
	const Vec3				trans10		= transf * Vec3(1.0f, 0.0f, 1.0f);

	// Derivates.
	const float dudx = (trans10.x() - trans00.x()) * (float)srcWidth / dstSize.x();
	const float dudy = (trans01.x() - trans00.x()) * (float)srcWidth / dstSize.y();
	const float dvdx = (trans10.y() - trans00.y()) * (float)srcHeight / dstSize.x();
	const float dvdy = (trans01.y() - trans00.y()) * (float)srcHeight / dstSize.y();
	const float dwdx = (trans10.z() - trans00.z()) * (float)srcDepth / dstSize.x();
	const float dwdy = (trans01.z() - trans00.z()) * (float)srcDepth / dstSize.y();

	return deFloatLog2(deFloatSqrt(de::max(dudx*dudx + dvdx*dvdx + dwdx*dwdx, dudy*dudy + dvdy*dvdy + dwdy*dwdy)));
}